

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildAndroidMKGenerator.cxx
# Opt level: O3

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties
               (cmGeneratorTarget *target,ostream *os,ImportPropertyMap *properties,
               GenerateType type,string *config)

{
  _Rb_tree_node_base *p_Var1;
  cmMakefile *this;
  cmLinkItem *pcVar2;
  cmGeneratorTarget *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  PolicyStatus PVar6;
  int iVar7;
  TargetType TVar8;
  ostream *poVar9;
  cmLinkInterfaceLibraries *pcVar10;
  string *in_name;
  _Base_ptr p_Var11;
  cmLinkImplementation *pcVar12;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var13;
  _Base_ptr p_Var14;
  cmLinkItem *this_00;
  char *pcVar15;
  _func_int **pp_Var16;
  string *i;
  pointer pbVar17;
  bool bVar18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkFlagsList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includeList;
  ostringstream w;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  GenerateType local_1ec;
  undefined1 local_1e8 [32];
  string *local_1c8;
  cmGeneratorTarget *local_1c0;
  ostream *local_1b8;
  _Rb_tree_node_base *local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_1ec = type;
  local_1c8 = config;
  PVar6 = cmPolicies::PolicyMap::Get(&target->PolicyMap,CMP0022);
  if ((PVar6 == WARN) ||
     (PVar6 = cmPolicies::PolicyMap::Get(&target->PolicyMap,CMP0022), PVar6 == OLD)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar15 = "install( EXPORT_ANDROID_MK ...) called with policy CMP0022";
    if (local_1ec == BUILD) {
      pcVar15 = "export(TARGETS ... ANDROID_MK) called with policy CMP0022";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,pcVar15,(ulong)(local_1ec != BUILD) + 0x39);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," set to OLD for target ",0x17);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(target->Target->Name)._M_dataplus._M_p,
                        (target->Target->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,". ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"The export will only work with CMP0022 set to NEW.",0x32);
    this = target->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(this,AUTHOR_WARNING,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if ((properties->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"LOCAL_CPP_FEATURES := rtti exceptions\n",0x26);
    p_Var11 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1b0 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    pcVar3 = target;
    poVar9 = os;
    if (p_Var11 != local_1b0) {
      do {
        local_1b8 = poVar9;
        local_1c0 = pcVar3;
        pp_Var16 = (_func_int **)(local_1a8 + 0x10);
        p_Var1 = p_Var11 + 1;
        iVar7 = std::__cxx11::string::compare((char *)p_Var1);
        if (iVar7 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_CPP_FEATURES += ",0x16);
          pcVar15 = *(char **)(p_Var11 + 2);
          p_Var14 = p_Var11[2]._M_parent;
          poVar9 = os;
LAB_00344208:
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar15,(long)p_Var14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)p_Var1);
          if (iVar7 == 0) {
            local_1a8._8_8_ = 0;
            local_198[0]._M_local_buf[0] = '\0';
            local_238._M_string_length = 0;
            local_238.field_2._M_allocated_capacity =
                 local_238.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_1e8._0_8_ = local_1e8 + 0x10;
            local_1e8._8_8_ = (pointer)0x0;
            local_1e8._16_8_ = local_1e8._16_8_ & 0xffffffffffffff00;
            local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
            local_1a8._0_8_ = pp_Var16;
            pcVar10 = cmGeneratorTarget::GetLinkInterfaceLibraries(target,local_1c8,target,false);
            pcVar2 = (pcVar10->Libraries).
                     super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            os = local_1b8;
            for (this_00 = (pcVar10->Libraries).
                           super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                           super__Vector_impl_data._M_start; local_1b8 = os, this_00 != pcVar2;
                this_00 = this_00 + 1) {
              pcVar3 = this_00->Target;
              in_name = cmLinkItem::AsStr_abi_cxx11_(this_00);
              if (pcVar3 == (cmGeneratorTarget *)0x0) {
                if (local_1ec == INSTALL) {
                  std::__cxx11::string::substr((ulong)&local_210,(ulong)in_name);
                  iVar7 = std::__cxx11::string::compare((char *)&local_210);
                  bVar18 = iVar7 == 0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_210._M_dataplus._M_p != &local_210.field_2) {
                    operator_delete(local_210._M_dataplus._M_p,
                                    local_210.field_2._M_allocated_capacity + 1);
                  }
                }
                else {
                  bVar18 = false;
                }
                bVar5 = cmsys::SystemTools::FileIsFullPath(in_name);
                if (bVar5) {
LAB_0034438f:
                  std::operator+(&local_210," ",in_name);
                  std::__cxx11::string::_M_append(local_1e8,(ulong)local_210._M_dataplus._M_p);
                  goto LAB_00344415;
                }
                std::__cxx11::string::substr((ulong)&local_210,(ulong)in_name);
                iVar7 = std::__cxx11::string::compare((char *)&local_210);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_210._M_dataplus._M_p != &local_210.field_2) {
                  operator_delete(local_210._M_dataplus._M_p,
                                  local_210.field_2._M_allocated_capacity + 1);
                }
                if (bVar18 || iVar7 == 0) goto LAB_0034438f;
                if (in_name->_M_string_length != 0) {
                  std::operator+(&local_210," -l",in_name);
                  std::__cxx11::string::_M_append(local_1e8,(ulong)local_210._M_dataplus._M_p);
                  goto LAB_00344415;
                }
              }
              else {
                TVar8 = cmGeneratorTarget::GetType(pcVar3);
                if ((TVar8 == SHARED_LIBRARY) ||
                   (TVar8 = cmGeneratorTarget::GetType(pcVar3), TVar8 == MODULE_LIBRARY)) {
                  std::operator+(&local_210," ",in_name);
                  std::__cxx11::string::_M_append
                            ((char *)&local_238,(ulong)local_210._M_dataplus._M_p);
                }
                else {
                  std::operator+(&local_210," ",in_name);
                  std::__cxx11::string::_M_append(local_1a8,(ulong)local_210._M_dataplus._M_p);
                }
LAB_00344415:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_210._M_dataplus._M_p != &local_210.field_2) {
                  operator_delete(local_210._M_dataplus._M_p,
                                  local_210.field_2._M_allocated_capacity + 1);
                }
              }
              os = local_1b8;
            }
            if ((char *)local_238._M_string_length != (char *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (os,"LOCAL_SHARED_LIBRARIES :=",0x19);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (os,local_238._M_dataplus._M_p,local_238._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            }
            if (local_1a8._8_8_ != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (os,"LOCAL_STATIC_LIBRARIES :=",0x19);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (os,(char *)local_1a8._0_8_,local_1a8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            }
            if ((pointer)local_1e8._8_8_ != (pointer)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_EXPORT_LDLIBS :=",0x16);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (os,(char *)local_1e8._0_8_,local_1e8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            }
            target = local_1c0;
            if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
              operator_delete((void *)local_1e8._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_1e8._16_8_)->_M_p + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)p_Var1);
            if (iVar7 != 0) {
              iVar7 = std::__cxx11::string::compare((char *)p_Var1);
              if (iVar7 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>(os,"# ",2);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   (os,*(char **)(p_Var11 + 1),(long)p_Var11[1]._M_parent);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                pcVar15 = *(char **)(p_Var11 + 2);
                p_Var14 = p_Var11[2]._M_parent;
                goto LAB_00344208;
              }
              std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_EXPORT_LDFLAGS := ",0x18)
              ;
              local_238._M_dataplus._M_p = (pointer)0x0;
              local_238._M_string_length = 0;
              local_238.field_2._M_allocated_capacity = 0;
              cmSystemTools::ExpandListArgument
                        ((string *)(p_Var11 + 2),
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_238,false);
              cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((string *)local_1a8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_238," ");
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (os,(char *)local_1a8._0_8_,local_1a8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
              if ((_func_int **)local_1a8._0_8_ != pp_Var16) {
                operator_delete((void *)local_1a8._0_8_,
                                CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                         local_198[0]._M_local_buf[0]) + 1);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_238);
              goto LAB_00344712;
            }
            local_1a8._0_8_ = pp_Var16;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1a8,*(long *)(p_Var11 + 2),
                       (long)&(p_Var11[2]._M_parent)->_M_color + *(long *)(p_Var11 + 2));
            local_1e8._0_8_ = (pointer)0x0;
            local_1e8._8_8_ = (pointer)0x0;
            local_1e8._16_8_ = (pointer)0x0;
            cmSystemTools::ExpandListArgument
                      ((string *)local_1a8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1e8,false);
            std::__ostream_insert<char,std::char_traits<char>>
                      (os,"LOCAL_EXPORT_C_INCLUDES := ",0x1b);
            uVar4 = local_1e8._8_8_;
            local_238._M_string_length = 0;
            local_238.field_2._M_allocated_capacity =
                 local_238.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
            for (pbVar17 = (pointer)local_1e8._0_8_; pbVar17 != (pointer)uVar4;
                pbVar17 = pbVar17 + 1) {
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (os,local_238._M_dataplus._M_p,local_238._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,(pbVar17->_M_dataplus)._M_p,pbVar17->_M_string_length);
              std::__cxx11::string::_M_replace
                        ((ulong)&local_238,0,(char *)local_238._M_string_length,0x57be2e);
            }
            std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1
                             );
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1e8);
          }
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,
                            CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                     local_198[0]._M_local_buf[0]) + 1);
          }
        }
LAB_00344712:
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        pcVar3 = local_1c0;
        poVar9 = local_1b8;
      } while (p_Var11 != local_1b0);
    }
  }
  TVar8 = cmGeneratorTarget::GetType(target);
  if (TVar8 == STATIC_LIBRARY) {
    pcVar12 = cmGeneratorTarget::GetLinkImplementation(target,local_1c8);
    _Var13 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[4]>>
                       ((pcVar12->Languages).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (pcVar12->Languages).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,"CXX");
    if (_Var13._M_current !=
        (pcVar12->Languages).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_HAS_CPP := true\n",0x16);
    }
  }
  TVar8 = cmGeneratorTarget::GetType(target);
  if (TVar8 - STATIC_LIBRARY < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,&DAT_0055962c + *(int *)(&DAT_0055962c + (ulong)(TVar8 - STATIC_LIBRARY) * 4),0x23
              );
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  return;
}

Assistant:

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties(
  const cmGeneratorTarget* target, std::ostream& os,
  const ImportPropertyMap& properties, GenerateType type,
  std::string const& config)
{
  const bool newCMP0022Behavior =
    target->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
    target->GetPolicyStatusCMP0022() != cmPolicies::OLD;
  if (!newCMP0022Behavior) {
    std::ostringstream w;
    if (type == cmExportBuildAndroidMKGenerator::BUILD) {
      w << "export(TARGETS ... ANDROID_MK) called with policy CMP0022";
    } else {
      w << "install( EXPORT_ANDROID_MK ...) called with policy CMP0022";
    }
    w << " set to OLD for target " << target->Target->GetName() << ". "
      << "The export will only work with CMP0022 set to NEW.";
    target->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
  }
  if (!properties.empty()) {
    os << "LOCAL_CPP_FEATURES := rtti exceptions\n";
    for (auto const& property : properties) {
      if (property.first == "INTERFACE_COMPILE_OPTIONS") {
        os << "LOCAL_CPP_FEATURES += ";
        os << (property.second) << "\n";
      } else if (property.first == "INTERFACE_LINK_LIBRARIES") {
        std::string staticLibs;
        std::string sharedLibs;
        std::string ldlibs;
        cmLinkInterfaceLibraries const* linkIFace =
          target->GetLinkInterfaceLibraries(config, target, false);
        for (cmLinkItem const& item : linkIFace->Libraries) {
          cmGeneratorTarget const* gt = item.Target;
          std::string const& lib = item.AsStr();
          if (gt) {

            if (gt->GetType() == cmStateEnums::SHARED_LIBRARY ||
                gt->GetType() == cmStateEnums::MODULE_LIBRARY) {
              sharedLibs += " " + lib;
            } else {
              staticLibs += " " + lib;
            }
          } else {
            bool relpath = false;
            if (type == cmExportBuildAndroidMKGenerator::INSTALL) {
              relpath = lib.substr(0, 3) == "../";
            }
            // check for full path or if it already has a -l, or
            // in the case of an install check for relative paths
            // if it is full or a link library then use string directly
            if (cmSystemTools::FileIsFullPath(lib) ||
                lib.substr(0, 2) == "-l" || relpath) {
              ldlibs += " " + lib;
              // if it is not a path and does not have a -l then add -l
            } else if (!lib.empty()) {
              ldlibs += " -l" + lib;
            }
          }
        }
        if (!sharedLibs.empty()) {
          os << "LOCAL_SHARED_LIBRARIES :=" << sharedLibs << "\n";
        }
        if (!staticLibs.empty()) {
          os << "LOCAL_STATIC_LIBRARIES :=" << staticLibs << "\n";
        }
        if (!ldlibs.empty()) {
          os << "LOCAL_EXPORT_LDLIBS :=" << ldlibs << "\n";
        }
      } else if (property.first == "INTERFACE_INCLUDE_DIRECTORIES") {
        std::string includes = property.second;
        std::vector<std::string> includeList;
        cmSystemTools::ExpandListArgument(includes, includeList);
        os << "LOCAL_EXPORT_C_INCLUDES := ";
        std::string end;
        for (std::string const& i : includeList) {
          os << end << i;
          end = "\\\n";
        }
        os << "\n";
      } else if (property.first == "INTERFACE_LINK_OPTIONS") {
        os << "LOCAL_EXPORT_LDFLAGS := ";
        std::vector<std::string> linkFlagsList;
        cmSystemTools::ExpandListArgument(property.second, linkFlagsList);
        os << cmJoin(linkFlagsList, " ") << "\n";
      } else {
        os << "# " << property.first << " " << (property.second) << "\n";
      }
    }
  }

  // Tell the NDK build system if prebuilt static libraries use C++.
  if (target->GetType() == cmStateEnums::STATIC_LIBRARY) {
    cmLinkImplementation const* li = target->GetLinkImplementation(config);
    if (std::find(li->Languages.begin(), li->Languages.end(), "CXX") !=
        li->Languages.end()) {
      os << "LOCAL_HAS_CPP := true\n";
    }
  }

  switch (target->GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      os << "include $(PREBUILT_SHARED_LIBRARY)\n";
      break;
    case cmStateEnums::STATIC_LIBRARY:
      os << "include $(PREBUILT_STATIC_LIBRARY)\n";
      break;
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::UTILITY:
    case cmStateEnums::OBJECT_LIBRARY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::INTERFACE_LIBRARY:
    case cmStateEnums::UNKNOWN_LIBRARY:
      break;
  }
  os << "\n";
}